

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
          (ValidationErrorTest *this,string_view file_name,string_view file_text,
          string_view expected_errors)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  char *pcVar3;
  StringLike<std::basic_string_view<char>_> *substring;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  AssertHelper local_248;
  Message local_240;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1c8;
  Message local_1c0 [3];
  size_t local_1a8;
  char *pcStack_1a0;
  size_t local_198;
  char *pcStack_190;
  FileDescriptorProto local_188;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  MockErrorCollector error_collector;
  ValidationErrorTest *this_local;
  string_view file_text_local;
  string_view file_name_local;
  
  pcVar3 = file_text._M_str;
  MockErrorCollector::MockErrorCollector((MockErrorCollector *)&gtest_ar_.message_);
  local_1a8 = file_text._M_len;
  pcStack_1a0 = pcVar3;
  local_198 = file_name._M_len;
  pcStack_190 = file_name._M_str;
  ParseFile(&local_188,this,file_name,file_text);
  pFVar2 = DescriptorPool::BuildFileCollectingErrors
                     (&this->pool_,&local_188,(ErrorCollector *)&gtest_ar_.message_);
  local_89 = pFVar2 == (FileDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  FileDescriptorProto::~FileDescriptorProto(&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_88,
               (AssertionResult *)
               "pool_.BuildFileCollectingErrors(ParseFile(file_name, file_text), &error_collector) == nullptr"
               ,"false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x120a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  testing::HasSubstr<std::basic_string_view<char,std::char_traits<char>>>
            (&local_238,(testing *)&expected_errors,substring);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_218,(internal *)&local_238,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_1f8,(char *)&local_218,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "error_collector.text_");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_218);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x120b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  MockErrorCollector::~MockErrorCollector((MockErrorCollector *)&gtest_ar_.message_);
  return;
}

Assistant:

void ParseAndBuildFileWithErrorSubstr(absl::string_view file_name,
                                        absl::string_view file_text,
                                        absl::string_view expected_errors) {
    MockErrorCollector error_collector;
    EXPECT_TRUE(pool_.BuildFileCollectingErrors(ParseFile(file_name, file_text),
                                                &error_collector) == nullptr);
    EXPECT_THAT(error_collector.text_, HasSubstr(expected_errors));
  }